

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::InvalidShaderCompilerCase::InvalidShaderCompilerCase
          (InvalidShaderCompilerCase *this,Context *context,char *name,char *description,int caseID,
          InvalidityType invalidityType)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint64 dVar4;
  TestContext *this_00;
  CommandLine *this_01;
  int local_90;
  int cmdLineIterCount;
  InvalidityType invalidityType_local;
  int caseID_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  InvalidShaderCompilerCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InvalidShaderCompilerCase_032a4b90;
  this->m_invalidityType = invalidityType;
  dVar4 = deGetTime();
  dVar1 = deUint64Hash(dVar4);
  dVar4 = deGetMicroseconds();
  dVar2 = deUint64Hash(dVar4);
  dVar3 = ::deInt32Hash(caseID);
  this->m_startHash = dVar1 ^ dVar2 ^ dVar3;
  this_00 = gles3::Context::getTestContext(context);
  this_01 = tcu::TestContext::getCommandLine(this_00);
  local_90 = tcu::CommandLine::getTestIterationCount(this_01);
  if (local_90 < 1) {
    local_90 = 0xf;
  }
  this->m_minimumMeasurementCount = local_90;
  this->m_maximumMeasurementCount = this->m_minimumMeasurementCount * 3;
  return;
}

Assistant:

InvalidShaderCompilerCase::InvalidShaderCompilerCase (Context& context, const char* name, const char* description, int caseID, InvalidityType invalidityType)
	: TestCase						(context, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_invalidityType				(invalidityType)
	, m_startHash					((deUint32)(deUint64Hash(deGetTime()) ^ deUint64Hash(deGetMicroseconds()) ^ deInt32Hash(caseID)))
{
	int cmdLineIterCount = context.getTestContext().getCommandLine().getTestIterationCount();
	m_minimumMeasurementCount = cmdLineIterCount > 0 ? cmdLineIterCount : DEFAULT_MINIMUM_MEASUREMENT_COUNT;
	m_maximumMeasurementCount = 3*m_minimumMeasurementCount;
}